

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

size_t nivalis::util::find_equality(string_view expr,bool allow_ineq,bool enforce_no_adj_comparison)

{
  char c_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  byte in_CL;
  byte in_DL;
  char c;
  size_t i;
  size_t stkh;
  ulong local_30;
  long local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    local_28 = 0;
    for (local_30 = 0;
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18),
        local_30 < sVar2 - 1; local_30 = local_30 + 1) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,local_30)
      ;
      c_00 = *pvVar3;
      bVar1 = is_open_bracket(c_00);
      if (bVar1) {
        local_28 = local_28 + 1;
      }
      else {
        bVar1 = is_close_bracket(c_00);
        if (bVar1) {
          local_28 = local_28 + -1;
        }
        else if ((local_28 == 0) &&
                (((c_00 == '=' || (((in_DL & 1) != 0 && ((c_00 == '<' || (c_00 == '>')))))) &&
                 (local_30 != 0)))) {
          if ((in_CL & 1) == 0) {
            return local_30;
          }
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&local_18,local_30 - 1);
          bVar1 = is_comp_operator(*pvVar3);
          if ((!bVar1) &&
             (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 (&local_18,local_30 - 1), *pvVar3 != '!')) {
            pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&local_18,local_30 + 1);
            bVar1 = is_comp_operator(*pvVar3);
            if ((!bVar1) &&
               (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   (&local_18,local_30 + 1), *pvVar3 != '!')) {
              return local_30;
            }
          }
        }
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t find_equality(std::string_view expr,
        bool allow_ineq,
        bool enforce_no_adj_comparison) {
    if (expr.empty()) return -1;
    size_t stkh = 0;
    for (size_t i = 0; i < expr.size() - 1; ++i) {
        const char c = expr[i];
        if (is_open_bracket(c)) {
            ++stkh;
        } else if (is_close_bracket(c)) {
            --stkh;
        } else if (stkh == 0 &&
                (c == '=' || (allow_ineq && (c == '<' || c== '>')))
                    && i > 0 &&
                   (!enforce_no_adj_comparison ||
                       (!util::is_comp_operator(expr[i-1]) &&
                       expr[i-1] != '!' &&
                       !util::is_comp_operator(expr[i+1]) &&
                       expr[i+1] != '!'))) {
            return i;
        }
    }
    return -1;
}